

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

int32_t __thiscall
icu_63::Calendar::computeZoneOffset(Calendar *this,double millis,double millisInDay,UErrorCode *ec)

{
  TimeZone *pTVar1;
  BasicTimeZone *pBVar2;
  int iVar3;
  int32_t dstOffset;
  int32_t rawOffset;
  int32_t tmpDst;
  int32_t tmpRaw;
  int local_48;
  int local_44;
  double local_40;
  int local_38;
  int local_34;
  
  local_40 = millis + millisInDay;
  pBVar2 = getBasicTimeZone(this);
  if (pBVar2 == (BasicTimeZone *)0x0) {
    pTVar1 = this->fZone;
    (*(pTVar1->super_UObject)._vptr_UObject[6])(local_40,pTVar1,1,&local_44,&local_48,ec);
    if (this->fRepeatedWallTime == UCAL_WALLTIME_FIRST) {
      (*(pTVar1->super_UObject)._vptr_UObject[6])
                ((local_40 - (double)(local_48 + local_44)) + -21600000.0,pTVar1,0,&local_34,
                 &local_38,ec);
      iVar3 = (local_48 + local_44) - (local_34 + local_38);
      if (iVar3 < 0) {
        (*(pTVar1->super_UObject)._vptr_UObject[6])
                  ((double)iVar3 + local_40,pTVar1,1,&local_44,&local_48,ec);
        goto LAB_001e90cc;
      }
    }
    if (this->fSkippedWallTime == UCAL_WALLTIME_FIRST) {
      (*(pTVar1->super_UObject)._vptr_UObject[6])
                (local_40 - (double)(local_48 + local_44),pTVar1,0,&local_44,&local_48,ec);
    }
  }
  else {
    (*(pBVar2->super_TimeZone).super_UObject._vptr_UObject[0x14])
              (local_40,pBVar2,
               (ulong)((uint)(this->fSkippedWallTime == UCAL_WALLTIME_FIRST) * 8 + 4),
               (ulong)((uint)(this->fRepeatedWallTime != UCAL_WALLTIME_FIRST) * 8 + 4),&local_44,
               &local_48,ec);
  }
LAB_001e90cc:
  return local_48 + local_44;
}

Assistant:

int32_t Calendar::computeZoneOffset(double millis, double millisInDay, UErrorCode &ec) {
    int32_t rawOffset, dstOffset;
    UDate wall = millis + millisInDay;
    BasicTimeZone* btz = getBasicTimeZone();
    if (btz) {
        int duplicatedTimeOpt = (fRepeatedWallTime == UCAL_WALLTIME_FIRST) ? BasicTimeZone::kFormer : BasicTimeZone::kLatter;
        int nonExistingTimeOpt = (fSkippedWallTime == UCAL_WALLTIME_FIRST) ? BasicTimeZone::kLatter : BasicTimeZone::kFormer;
        btz->getOffsetFromLocal(wall, nonExistingTimeOpt, duplicatedTimeOpt, rawOffset, dstOffset, ec);
    } else {
        const TimeZone& tz = getTimeZone();
        // By default, TimeZone::getOffset behaves UCAL_WALLTIME_LAST for both.
        tz.getOffset(wall, TRUE, rawOffset, dstOffset, ec);

        UBool sawRecentNegativeShift = FALSE;
        if (fRepeatedWallTime == UCAL_WALLTIME_FIRST) {
            // Check if the given wall time falls into repeated time range
            UDate tgmt = wall - (rawOffset + dstOffset);

            // Any negative zone transition within last 6 hours?
            // Note: The maximum historic negative zone transition is -3 hours in the tz database.
            // 6 hour window would be sufficient for this purpose.
            int32_t tmpRaw, tmpDst;
            tz.getOffset(tgmt - 6*60*60*1000, FALSE, tmpRaw, tmpDst, ec);
            int32_t offsetDelta = (rawOffset + dstOffset) - (tmpRaw + tmpDst);

            U_ASSERT(offsetDelta < -6*60*60*1000);
            if (offsetDelta < 0) {
                sawRecentNegativeShift = TRUE;
                // Negative shift within last 6 hours. When UCAL_WALLTIME_FIRST is used and the given wall time falls
                // into the repeated time range, use offsets before the transition.
                // Note: If it does not fall into the repeated time range, offsets remain unchanged below.
                tz.getOffset(wall + offsetDelta, TRUE, rawOffset, dstOffset, ec);
            }
        }
        if (!sawRecentNegativeShift && fSkippedWallTime == UCAL_WALLTIME_FIRST) {
            // When skipped wall time option is WALLTIME_FIRST,
            // recalculate offsets from the resolved time (non-wall).
            // When the given wall time falls into skipped wall time,
            // the offsets will be based on the zone offsets AFTER
            // the transition (which means, earliest possibe interpretation).
            UDate tgmt = wall - (rawOffset + dstOffset);
            tz.getOffset(tgmt, FALSE, rawOffset, dstOffset, ec);
        }
    }
    return rawOffset + dstOffset;
}